

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  double dVar22;
  undefined1 in_register_00001248 [56];
  undefined1 auVar24 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar25 [64];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  auVar25._8_56_ = in_register_00001288;
  auVar25._0_8_ = zeta;
  auVar24._8_56_ = in_register_00001248;
  auVar24._0_8_ = eta;
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = xi;
  auVar10 = auVar24._0_16_;
  auVar5 = vfmsub213sd_fma(auVar10,auVar10,auVar10);
  auVar18 = vfmadd213sd_fma(auVar10,auVar10,auVar10);
  auVar14 = auVar21._0_16_;
  auVar17 = auVar25._0_16_;
  auVar9 = vunpcklpd_avx(auVar17,auVar14);
  auVar16._8_8_ = &DAT_bff0000000000000;
  auVar16._0_8_ = &DAT_bff0000000000000;
  auVar4 = vaddpd_avx512vl(auVar9,auVar16);
  dVar2 = eta + -1.0;
  auVar9 = vfmadd231sd_fma(auVar5,auVar14,auVar14);
  auVar18 = vfmadd231sd_fma(auVar18,auVar14,auVar14);
  auVar5 = vaddsd_avx512f(auVar9,auVar14);
  auVar6 = vaddsd_avx512f(auVar14,ZEXT816(0x3ff0000000000000));
  dVar26 = auVar4._0_8_;
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  auVar7 = vfmadd231sd_avx512f(auVar5,auVar17,auVar17);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar18._0_8_ + xi;
  auVar5 = vfmadd231sd_fma(auVar36,auVar17,auVar17);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar9._0_8_ - xi;
  auVar14 = vfmadd231sd_fma(auVar32,auVar17,auVar17);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar18._0_8_ - xi;
  auVar18 = vfmadd231sd_fma(auVar34,auVar17,auVar17);
  dVar27 = auVar3._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar26 * 0.0625;
  auVar8 = vmulsd_avx512f(auVar6,auVar30);
  auVar9 = vaddsd_avx512f(auVar7,auVar17);
  auVar9 = vunpcklpd_avx(auVar10,auVar9);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar14._0_8_ + zeta;
  auVar10 = vaddsd_avx512f(auVar19,ZEXT816(0xc000000000000000));
  auVar20._0_8_ = auVar9._0_8_ + 1.0;
  auVar20._8_8_ = auVar9._8_8_ + -2.0;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar14._0_8_ - zeta;
  auVar11 = vaddsd_avx512f(auVar33,ZEXT816(0xc000000000000000));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar5._0_8_ + zeta;
  auVar15 = ZEXT816(0xc000000000000000);
  auVar9 = vaddsd_avx512f(auVar23,auVar15);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = auVar5._0_8_ - zeta;
  auVar12 = vaddsd_avx512f(auVar37,auVar15);
  auVar19 = ZEXT816(0x3fa0000000000000);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0] = dVar2 * dVar26 * 0.0625 * dVar27 * auVar9._0_8_;
  dVar29 = auVar6._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[1] = dVar2 * dVar26 * dVar27 * dVar27 * dVar29 * this->m_lenX * 0.03125;
  auVar13 = vaddsd_avx512f(auVar17,ZEXT816(0x3ff0000000000000));
  auVar5 = vaddsd_avx512f(auVar18,auVar17);
  auVar14 = vsubsd_avx512f(auVar7,auVar17);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar19,auVar9);
  auVar5 = vaddsd_avx512f(auVar5,auVar15);
  dVar22 = auVar13._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar18._0_8_ - zeta;
  auVar15 = vaddsd_avx512f(auVar35,auVar15);
  auVar16 = vaddsd_avx512f(auVar14,ZEXT816(0xc000000000000000));
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar17 = vmulsd_avx512f(auVar4,ZEXT816(0xbfb0000000000000));
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[2] = auVar9._0_8_ * dVar2 * dVar2 * dVar26 * dVar27;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[3] = this->m_lenZ * 0.03125 * dVar22 * dVar26 * dVar26 * dVar27 * dVar2;
  auVar9 = vmulsd_avx512f(auVar6,auVar17);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar9._0_8_ * dVar2;
  auVar9 = vmulsd_avx512f(auVar31,auVar5);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[4] = auVar9._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[5] = dVar29 * dVar29 * this->m_lenX * 0.03125 * dVar27 * dVar26 * dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar18);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2;
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 6;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar5);
  auVar9 = vmulsd_avx512f(auVar13,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 7;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar9 = vmulsd_avx512f(auVar20,auVar8);
  auVar9 = vmulsd_avx512f(auVar9,auVar10);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 8;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = this->m_lenX;
  auVar5 = ZEXT816(0xbfa0000000000000);
  auVar9 = vmulsd_avx512f(auVar5,auVar14);
  auVar9 = vmulsd_avx512f(auVar3,auVar9);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 9;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar5,auVar7);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 10;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(auVar19,auVar8);
  auVar9 = vmulsd_avx512f(auVar13,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vunpcklpd_avx512vl(auVar9,auVar17);
  auVar18 = vunpcklpd_avx512vl(auVar6,auVar20);
  auVar9 = vmulpd_avx512vl(auVar4,auVar9);
  auVar9 = vmulpd_avx512vl(auVar18,auVar9);
  auVar9 = vmulpd_avx512vl(auVar20,auVar9);
  *(undefined1 (*) [16])
   ((Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
    array + 0xb) = auVar9;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_lenX;
  auVar9 = vmulsd_avx512f(auVar5,auVar10);
  auVar9 = vmulsd_avx512f(auVar6,auVar9);
  auVar9 = vmulsd_avx512f(auVar3,auVar9);
  auVar9 = vmulsd_avx512f(auVar3,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 0xd;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar19,auVar6);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar3,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 0xe;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(auVar5,auVar17);
  auVar9 = vmulsd_avx512f(auVar13,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar4,auVar9);
  auVar9 = vmulsd_avx512f(auVar3,auVar9);
  auVar9 = vmulsd_avx512f(auVar20,auVar9);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 0xf;
  vmovsd_avx512f(auVar9);
  *pdVar1 = *pdVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar22 * -0.0625;
  auVar9 = vmulsd_avx512f(auVar3,auVar38);
  auVar9 = vmulsd_avx512f(auVar28,auVar9);
  auVar9 = vmulsd_avx512f(auVar9,auVar12);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x10] = auVar9._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_lenX;
  auVar18 = ZEXT816(0xbfa0000000000000);
  auVar9 = vmulsd_avx512f(auVar18,auVar3);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x11] = dVar29 * auVar9._0_8_ * dVar27 * dVar27 * dVar22 * dVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar18,auVar4);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x12] = auVar9._0_8_ * auVar20._0_8_ * dVar2 * dVar2 * dVar22 * dVar27;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x13] = this->m_lenZ * 0.03125 * dVar26 * dVar22 * dVar22 * dVar27 * dVar2;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x14] = dVar29 * dVar22 * 0.0625 * dVar2 * auVar15._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->m_lenX;
  auVar9 = vmulsd_avx512f(auVar18,auVar12);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x15] = dVar29 * dVar29 * auVar9._0_8_ * dVar27 * dVar22 * dVar2;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x16] = dVar29 * this->m_lenY * 0.03125 * auVar20._0_8_ * dVar2 * dVar2 * dVar22;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(auVar18,auVar13);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x17] = dVar29 * auVar9._0_8_ * dVar26 * dVar22 * dVar22 * dVar2;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x18] = dVar29 * dVar22 * -0.0625 * auVar20._0_8_ * auVar11._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x19] = dVar29 * dVar29 * this->m_lenX * 0.03125 * dVar27 * dVar22 * auVar20._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1a] = dVar29 * this->m_lenY * 0.03125 * dVar2 * auVar20._0_8_ * auVar20._0_8_ * dVar22;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1b] = dVar29 * this->m_lenZ * 0.03125 * dVar26 * dVar22 * dVar22 * auVar20._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1c] = dVar22 * 0.0625 * dVar27 * auVar20._0_8_ * auVar16._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1d] = auVar20._0_8_ * dVar22 * dVar27 * dVar27 * dVar29 * this->m_lenX * 0.03125;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->m_lenY;
  auVar9 = vmulsd_avx512f(auVar18,auVar11);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1e] = dVar27 * dVar22 * auVar20._0_8_ * auVar20._0_8_ * dVar2 * auVar9._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = this->m_lenZ;
  auVar9 = vmulsd_avx512f(auVar18,auVar15);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1f] = auVar20._0_8_ * dVar27 * dVar22 * dVar22 * dVar26 * auVar9._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_compact(VectorN& Sxi_compact, double xi, double eta, double zeta) {
    Sxi_compact(0) =
        0.0625 * (zeta - 1) * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + zeta * zeta + zeta - 2);
    Sxi_compact(1) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_compact(2) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1) * (eta - 1);
    Sxi_compact(4) =
        -0.0625 * (zeta - 1) * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + zeta * zeta + zeta - 2);
    Sxi_compact(5) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1) * (eta - 1);
    Sxi_compact(6) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1) * (eta - 1);
    Sxi_compact(8) =
        0.0625 * (zeta - 1) * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + zeta * zeta + zeta - 2);
    Sxi_compact(9) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1) * (eta + 1);
    Sxi_compact(10) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1) * (xi + 1);
    Sxi_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1) * (eta + 1);
    Sxi_compact(12) =
        -0.0625 * (zeta - 1) * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + zeta * zeta + zeta - 2);
    Sxi_compact(13) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_compact(14) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1) * (xi - 1);
    Sxi_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1) * (eta + 1);
    Sxi_compact(16) =
        -0.0625 * (zeta + 1) * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + zeta * zeta - zeta - 2);
    Sxi_compact(17) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_compact(18) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1) * (eta - 1);
    Sxi_compact(20) =
        0.0625 * (zeta + 1) * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + zeta * zeta - zeta - 2);
    Sxi_compact(21) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1) * (eta - 1);
    Sxi_compact(22) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1) * (eta - 1);
    Sxi_compact(24) =
        -0.0625 * (zeta + 1) * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + zeta * zeta - zeta - 2);
    Sxi_compact(25) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1) * (eta + 1);
    Sxi_compact(26) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1) * (xi + 1);
    Sxi_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1) * (eta + 1);
    Sxi_compact(28) =
        0.0625 * (zeta + 1) * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + zeta * zeta - zeta - 2);
    Sxi_compact(29) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_compact(30) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1) * (xi - 1);
    Sxi_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1) * (eta + 1);
}